

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstantFieldPropagation.cpp
# Opt level: O1

void __thiscall wasm::anon_unknown_227::PCVScanner::~PCVScanner(PCVScanner *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pTVar2;
  pointer pcVar3;
  
  pTVar2 = (this->
           super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
           ).
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
           .
           super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
           .
           super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
           .stack.flexible.
           super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pTVar2 != (pointer)0x0) {
    operator_delete(pTVar2,(long)*(pointer *)
                                  ((long)&(this->
                                          super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
                                          ).
                                          super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
                                          .
                                          super_PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                                          .
                                          super_Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>
                                          .stack.flexible.
                                          super__Vector_base<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task,_std::allocator<wasm::Walker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>::Task>_>
                                  + 0x10) - (long)pTVar2);
  }
  (this->super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>)
  .
  super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
  .super_Pass._vptr_Pass = (_func_int **)&PTR__Pass_00d87048;
  pcVar3 = (this->
           super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
           ).
           super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
           .super_Pass.name._M_dataplus._M_p;
  paVar1 = &(this->
            super_StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>
            ).
            super_WalkerPass<wasm::PostWalker<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_wasm::Visitor<wasm::StructUtils::StructScanner<wasm::PossibleConstantValues,_wasm::(anonymous_namespace)::PCVScanner>,_void>_>_>
            .super_Pass.name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x118);
  return;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<PCVScanner>(functionNewInfos, functionSetGetInfos);
  }